

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

Gia_Man_t * Gia_ManReduceConst(Gia_Man_t *pAig,int fVerbose)

{
  Gia_ManTer_t *p;
  int *pCi2Lit;
  Gia_Man_t *pGVar1;
  
  p = Gia_ManTerSimulate(pAig,fVerbose);
  pCi2Lit = Gia_ManTerCreateMap(p,fVerbose);
  Gia_ManTerDelete(p);
  pGVar1 = Gia_ManDupDfsCiMap(pAig,pCi2Lit,(Vec_Int_t *)0x0);
  if (pCi2Lit != (int *)0x0) {
    free(pCi2Lit);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManReduceConst( Gia_Man_t * pAig, int fVerbose )
{
    Gia_ManTer_t * p;
    Gia_Man_t * pNew = NULL;
    int * pCi2Lit;
    p = Gia_ManTerSimulate( pAig, fVerbose );
    Gia_ManTerAnalyze( p );
    pCi2Lit = Gia_ManTerCreateMap( p, fVerbose );
    Gia_ManTerDelete( p );
    pNew = Gia_ManDupDfsCiMap( pAig, pCi2Lit, NULL );
    ABC_FREE( pCi2Lit );
    return pNew;
}